

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addShapeConversion(TIntermediate *this,TType *type,TIntermTyped *node)

{
  TOperator TVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  EShSource EVar5;
  int iVar6;
  undefined4 extraout_var;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  undefined4 extraout_var_00;
  TIntermAggregate *pTVar10;
  TSourceLoc *pTVar11;
  TIntermediate *pTVar12;
  TIntermTyped *pTVar13;
  bool local_61;
  TIntermediate *local_58;
  int local_50;
  bool local_49;
  int x;
  bool isSimple;
  TIntermAggregate *rhsAggregate;
  long *plStack_38;
  int matSize;
  TType *sourceType;
  TIntermediate *pTStack_28;
  TOperator constructorOp;
  TIntermTyped *node_local;
  TType *type_local;
  TIntermediate *this_local;
  
  pTStack_28 = (TIntermediate *)node;
  node_local = (TIntermTyped *)type;
  type_local = (TType *)this;
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::operator==((TType *)CONCAT44(extraout_var,iVar3),(TType *)node_local);
  if (bVar2) {
    return (TIntermTyped *)pTStack_28;
  }
  plVar7 = (long *)(**(code **)(*(long *)pTStack_28 + 0xf0))();
  uVar8 = (**(code **)(*plVar7 + 0x128))();
  if ((uVar8 & 1) != 0) {
    return (TIntermTyped *)pTStack_28;
  }
  plVar7 = (long *)(**(code **)(*(long *)pTStack_28 + 0xf0))();
  uVar8 = (**(code **)(*plVar7 + 0xe8))();
  if ((uVar8 & 1) != 0) {
    return (TIntermTyped *)pTStack_28;
  }
  uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x25])();
  if ((uVar4 & 1) != 0) {
    return (TIntermTyped *)pTStack_28;
  }
  uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1d])();
  if ((uVar4 & 1) != 0) {
    return (TIntermTyped *)pTStack_28;
  }
  pTVar13 = node_local;
  sourceType._4_4_ = mapTypeToConstructorOp(this,(TType *)node_local);
  EVar5 = getSource(this);
  if (EVar5 == EShSourceHlsl) {
    plStack_38 = (long *)(**(code **)(*(long *)pTStack_28 + 0xf0))();
    uVar8 = (**(code **)(*plStack_38 + 200))();
    if (((uVar8 & 1) != 0) &&
       (uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1c])(), (uVar4 & 1) != 0)) {
      rhsAggregate._4_4_ = TType::computeNumComponents((TType *)node_local);
      pTVar10 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)pTVar13);
      TIntermAggregate::TIntermAggregate(pTVar10);
      _x = pTVar10;
      lVar9 = (**(code **)(*(long *)pTStack_28 + 0x60))();
      local_61 = true;
      if (lVar9 == 0) {
        lVar9 = (**(code **)(*(long *)pTStack_28 + 0x28))();
        local_61 = lVar9 != 0;
      }
      local_49 = local_61;
      if (local_61 == false) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                      ,0x49f,
                      "TIntermTyped *glslang::TIntermediate::addShapeConversion(const TType &, TIntermTyped *)"
                     );
      }
      for (local_50 = 0; pTVar13 = node_local, TVar1 = sourceType._4_4_, pTVar10 = _x,
          local_50 < rhsAggregate._4_4_; local_50 = local_50 + 1) {
        iVar3 = (*(_x->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                  [0x32])();
        local_58 = pTStack_28;
        std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                  ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   CONCAT44(extraout_var_00,iVar3),(value_type *)&local_58);
      }
      pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
      pTVar12 = (TIntermediate *)
                setAggregateOperator(this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11);
      return (TIntermTyped *)pTVar12;
    }
    uVar8 = (**(code **)(*plStack_38 + 0xc0))();
    if ((((uVar8 & 1) != 0) &&
        (uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x18])(), (uVar4 & 1) == 0)) ||
       ((uVar8 = (**(code **)(*plStack_38 + 0xc0))(), (uVar8 & 1) == 0 &&
        (uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x18])(), (uVar4 & 1) != 0))))
    {
      pTVar10 = makeAggregate(this,(TIntermNode *)pTStack_28);
      pTVar13 = node_local;
      TVar1 = sourceType._4_4_;
      pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
      pTVar12 = (TIntermediate *)
                setAggregateOperator(this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11);
      return (TIntermTyped *)pTVar12;
    }
    uVar8 = (**(code **)(*plStack_38 + 0xe0))();
    if ((uVar8 & 1) != 0) {
      uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1c])();
      if ((uVar4 & 1) == 0) {
        uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1b])();
        if (((((uVar4 & 1) != 0) &&
             (iVar3 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xc])(), iVar3 == 4)) &&
            (iVar3 = (**(code **)(*plStack_38 + 0x68))(), iVar3 == 2)) &&
           (iVar3 = (**(code **)(*plStack_38 + 0x70))(), iVar3 == 2)) {
          pTVar10 = makeAggregate(this,(TIntermNode *)pTStack_28);
          pTVar13 = node_local;
          TVar1 = sourceType._4_4_;
          pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
          pTVar12 = (TIntermediate *)
                    setAggregateOperator(this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11)
          ;
          return (TIntermTyped *)pTVar12;
        }
      }
      else {
        iVar3 = (**(code **)(*plStack_38 + 0x68))();
        iVar6 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xd])();
        if (iVar3 == iVar6) {
          iVar3 = (**(code **)(*plStack_38 + 0x70))();
          iVar6 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xe])();
          if (iVar3 == iVar6) goto LAB_0073d9d4;
        }
        iVar3 = (**(code **)(*plStack_38 + 0x68))();
        iVar6 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xd])();
        if (iVar6 <= iVar3) {
          iVar3 = (**(code **)(*plStack_38 + 0x70))();
          iVar6 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xe])();
          if (iVar6 <= iVar3) {
            pTVar10 = makeAggregate(this,(TIntermNode *)pTStack_28);
            pTVar13 = node_local;
            TVar1 = sourceType._4_4_;
            pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
            pTVar12 = (TIntermediate *)
                      setAggregateOperator
                                (this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11);
            return (TIntermTyped *)pTVar12;
          }
        }
      }
    }
LAB_0073d9d4:
    uVar8 = (**(code **)(*plStack_38 + 0xd8))();
    if ((uVar8 & 1) != 0) {
      uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1b])();
      if ((uVar4 & 1) == 0) {
        uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1c])();
        if ((((uVar4 & 1) != 0) && (iVar3 = (**(code **)(*plStack_38 + 0x60))(), iVar3 == 4)) &&
           ((iVar3 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xd])(), iVar3 == 2 &&
            (iVar3 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xe])(), iVar3 == 2)))) {
          pTVar10 = makeAggregate(this,(TIntermNode *)pTStack_28);
          pTVar13 = node_local;
          TVar1 = sourceType._4_4_;
          pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
          pTVar12 = (TIntermediate *)
                    setAggregateOperator(this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11)
          ;
          return (TIntermTyped *)pTVar12;
        }
      }
      else {
        iVar3 = (**(code **)(*plStack_38 + 0x60))();
        iVar6 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
        if (iVar6 < iVar3) {
          pTVar10 = makeAggregate(this,(TIntermNode *)pTStack_28);
          pTVar13 = node_local;
          TVar1 = sourceType._4_4_;
          pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
          pTVar12 = (TIntermediate *)
                    setAggregateOperator(this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11)
          ;
          return (TIntermTyped *)pTVar12;
        }
      }
    }
  }
  plVar7 = (long *)(**(code **)(*(long *)pTStack_28 + 0xf0))();
  uVar8 = (**(code **)(*plVar7 + 200))();
  if (((uVar8 & 1) == 0) ||
     (uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1b])(), (uVar4 & 1) == 0)) {
    plVar7 = (long *)(**(code **)(*(long *)pTStack_28 + 0xf0))();
    uVar8 = (**(code **)(*plVar7 + 0xd8))();
    if (((uVar8 & 1) == 0) ||
       (uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x18])(), (uVar4 & 1) == 0)) {
      uVar8 = (**(code **)(*(long *)pTStack_28 + 0x158))();
      if (((uVar8 & 1) != 0) &&
         (uVar4 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0x1b])(), (uVar4 & 1) != 0)) {
        iVar3 = (**(code **)(*(long *)pTStack_28 + 0x130))();
        iVar6 = (*(node_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
        if (iVar6 < iVar3) goto LAB_0073dbe3;
      }
      return (TIntermTyped *)pTStack_28;
    }
  }
LAB_0073dbe3:
  pTVar10 = makeAggregate(this,(TIntermNode *)pTStack_28);
  pTVar13 = node_local;
  TVar1 = sourceType._4_4_;
  pTVar11 = (TSourceLoc *)(*(code *)**(undefined8 **)pTStack_28)();
  pTVar12 = (TIntermediate *)
            setAggregateOperator(this,(TIntermNode *)pTVar10,TVar1,(TType *)pTVar13,pTVar11);
  return (TIntermTyped *)pTVar12;
}

Assistant:

TIntermTyped* TIntermediate::addShapeConversion(const TType& type, TIntermTyped* node)
{
    // no conversion needed
    if (node->getType() == type)
        return node;

    // structures and arrays don't change shape, either to or from
    if (node->getType().isStruct() || node->getType().isArray() ||
        type.isStruct() || type.isArray())
        return node;

    // The new node that handles the conversion
    TOperator constructorOp = mapTypeToConstructorOp(type);

    if (getSource() == EShSourceHlsl) {
        // HLSL rules for scalar, vector and matrix conversions:
        // 1) scalar can become anything, initializing every component with its value
        // 2) vector and matrix can become scalar, first element is used (warning: truncation)
        // 3) matrix can become matrix with less rows and/or columns (warning: truncation)
        // 4) vector can become vector with less rows size (warning: truncation)
        // 5a) vector 4 can become 2x2 matrix (special case) (same packing layout, its a reinterpret)
        // 5b) 2x2 matrix can become vector 4 (special case) (same packing layout, its a reinterpret)

        const TType &sourceType = node->getType();

        // rule 1 for scalar to matrix is special
        if (sourceType.isScalarOrVec1() && type.isMatrix()) {

            // HLSL semantics: the scalar (or vec1) is replicated to every component of the matrix.  Left to its
            // own devices, the constructor from a scalar would populate the diagonal.  This forces replication
            // to every matrix element.

            // Note that if the node is complex (e.g, a function call), we don't want to duplicate it here
            // repeatedly, so we copy it to a temp, then use the temp.
            const int matSize = type.computeNumComponents();
            TIntermAggregate* rhsAggregate = new TIntermAggregate();

            const bool isSimple = (node->getAsSymbolNode() != nullptr) || (node->getAsConstantUnion() != nullptr);

            if (!isSimple) {
                assert(0); // TODO: use node replicator service when available.
            }

            for (int x = 0; x < matSize; ++x)
                rhsAggregate->getSequence().push_back(node);

            return setAggregateOperator(rhsAggregate, constructorOp, type, node->getLoc());
        }

        // rule 1 and 2
        if ((sourceType.isScalar() && !type.isScalar()) || (!sourceType.isScalar() && type.isScalar()))
            return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());

        // rule 3 and 5b
        if (sourceType.isMatrix()) {
            // rule 3
            if (type.isMatrix()) {
                if ((sourceType.getMatrixCols() != type.getMatrixCols() || sourceType.getMatrixRows() != type.getMatrixRows()) &&
                    sourceType.getMatrixCols() >= type.getMatrixCols() && sourceType.getMatrixRows() >= type.getMatrixRows())
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            // rule 5b
            } else if (type.isVector()) {
                if (type.getVectorSize() == 4 && sourceType.getMatrixCols() == 2 && sourceType.getMatrixRows() == 2)
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            }
        }

        // rule 4 and 5a
        if (sourceType.isVector()) {
            // rule 4
            if (type.isVector())
            {
                if (sourceType.getVectorSize() > type.getVectorSize())
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            // rule 5a
            } else if (type.isMatrix()) {
                if (sourceType.getVectorSize() == 4 && type.getMatrixCols() == 2 && type.getMatrixRows() == 2)
                    return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());
            }
        }
    }

    // scalar -> vector or vec1 -> vector or
    // vector -> scalar or
    // bigger vector -> smaller vector
    if ((node->getType().isScalarOrVec1() && type.isVector()) ||
        (node->getType().isVector() && type.isScalar()) ||
        (node->isVector() && type.isVector() && node->getVectorSize() > type.getVectorSize()))
        return setAggregateOperator(makeAggregate(node), constructorOp, type, node->getLoc());

    return node;
}